

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O3

Node * __thiscall
sentencepiece::model::FreeList<sentencepiece::unigram::Lattice::Node>::Allocate
          (FreeList<sentencepiece::unigram::Lattice::Node> *this)

{
  pointer *pppNVar1;
  undefined8 *puVar2;
  ulong uVar3;
  iterator __position;
  undefined1 auVar4 [16];
  Node *pNVar5;
  long lVar6;
  pointer ppNVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  Node *chunk;
  Node *local_38;
  
  uVar10 = this->element_index_;
  sVar8 = this->chunk_index_;
  uVar3 = this->chunk_size_;
  if (uVar3 <= uVar10) {
    sVar8 = sVar8 + 1;
    this->chunk_index_ = sVar8;
    this->element_index_ = 0;
    uVar10 = 0;
  }
  ppNVar7 = (this->freelist_).
            super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->freelist_).
       super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (sVar8 == (long)__position._M_current - (long)ppNVar7 >> 3) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar3;
    uVar9 = 0xffffffffffffffff;
    if (SUB168(auVar4 * ZEXT816(0x30),8) == 0) {
      uVar9 = SUB168(auVar4 * ZEXT816(0x30),0);
    }
    pNVar5 = (Node *)operator_new__(uVar9);
    if (uVar3 != 0) {
      lVar6 = 0;
      do {
        puVar2 = (undefined8 *)((long)&(pNVar5->piece)._M_len + lVar6);
        *puVar2 = 0;
        puVar2[1] = 0;
        lVar6 = lVar6 + 0x30;
      } while (uVar3 * 0x30 != lVar6);
    }
    local_38 = pNVar5;
    memset(pNVar5,0,uVar3 * 0x30);
    if (__position._M_current ==
        (this->freelist_).
        super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<sentencepiece::unigram::Lattice::Node*,std::allocator<sentencepiece::unigram::Lattice::Node*>>
      ::_M_realloc_insert<sentencepiece::unigram::Lattice::Node*const&>
                ((vector<sentencepiece::unigram::Lattice::Node*,std::allocator<sentencepiece::unigram::Lattice::Node*>>
                  *)&this->freelist_,__position,&local_38);
      uVar10 = this->element_index_;
      sVar8 = this->chunk_index_;
    }
    else {
      *__position._M_current = pNVar5;
      pppNVar1 = &(this->freelist_).
                  super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppNVar1 = *pppNVar1 + 1;
    }
    ppNVar7 = (this->freelist_).
              super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  pNVar5 = ppNVar7[sVar8];
  this->element_index_ = uVar10 + 1;
  return pNVar5 + uVar10;
}

Assistant:

T* Allocate() {
    if (element_index_ >= chunk_size_) {
      ++chunk_index_;
      element_index_ = 0;
    }

    if (chunk_index_ == freelist_.size()) {
      T* chunk = new T[chunk_size_];
      memset(static_cast<void*>(chunk), 0, sizeof(*chunk) * chunk_size_);
      freelist_.push_back(chunk);
    }

    T* result = freelist_[chunk_index_] + element_index_;
    ++element_index_;

    return result;
  }